

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O2

void monitoring_thread_cleanup(void *arg)

{
  kqueue_head kVar1;
  uint *puVar2;
  thread_exit_state tVar3;
  int iVar4;
  kqueue *kq;
  
  if (monitoring_thread_state - THREAD_EXIT_STATE_CANCEL_LOCKED < 2) {
    kVar1.lh_first = kq_list.lh_first;
    if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED) {
      pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
      kVar1 = kq_list;
    }
    while (kq = kVar1.lh_first, kq != (kqueue *)0x0) {
      kVar1.lh_first = (kq->kq_entry).le_next;
      iVar4 = fcntl(kq->kq_id,1);
      puVar2 = fd_use_cnt;
      if (iVar4 < 0) {
        fd_use_cnt[kq->kq_id] = 0;
      }
      if (puVar2[kq->kq_id] == 0) {
        kqueue_free(kq);
      }
    }
    if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED) {
      pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    }
  }
  tVar3 = monitoring_thread_state;
  free(fd_map);
  fd_map = (int *)0x0;
  free(fd_use_cnt);
  fd_use_cnt = (uint *)0x0;
  monitoring_tid = 0;
  if (tVar3 != THREAD_EXIT_STATE_CANCEL_LOCKED) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
  return;
}

Assistant:

static void
monitoring_thread_cleanup(UNUSED void *arg)
{
    struct kqueue *kq, *kq_tmp;

    /*
     * If the entire process is exiting, then free all
     * the kqueues
     *
     * We do this because we don't reliably receive all the
     * close MONITORING_THREAD_SIGNALs before the process
     * exits, and this avoids ASAN or valgrind raising
     * spurious memory leaks.
     *
     * If the user _hasn't_ closed a KQ fd, then we don't
     * free the underlying memory, and it'll be correctly
     * reported as a memory leak.
     */
    if ((monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_LOCKED) ||
        (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED)) {

        /*
         * Keep the assertion in kqueue_free happy
         */
        if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED)
            tracing_mutex_lock(&kq_mtx);

        LIST_FOREACH_SAFE(kq, &kq_list, kq_entry, kq_tmp) {
            /*
             * We only cleanup kqueues where their file descriptor
             * has been closed.
             *
             * This is necessary because we can be told to exit
             * before the monitoring thread has a chance to process
             * the signal indicating that a kqueue has been
             * cleaned up, and this can lead to spurious reports
             * from LSAN.
             *
             * We only cleanup kqueues where the file descriptor has
             * been closed, because other kqueues may be in the
             * middle of operations with kq->kq_mtx held, and
             * attempting to clean them up would cause a deadlock.
             *
             * These kqueues are legitimate leaks, and should have
             * been freed by the user application before it exited.
             */
            dbg_printf("kq=%p - fd=%i explicitly checking for closeure", kq, kq->kq_id);
            if (fcntl(kq->kq_id, F_GETFD) < 0) {
                dbg_printf("kq=%p - fd=%i forcefully cleaning up, current use_count=%u: %s",
                           kq,
                           kq->kq_id, fd_use_cnt[kq->kq_id],
                           errno == EBADF ? "File descriptor already closed" : strerror(errno));
                fd_use_cnt[kq->kq_id] = 0;
            } else {
                /*
                 * If there's no use cnt for the kqueue then something
                 * has gone very wrong.
                 */
                assert(fd_use_cnt[kq->kq_id] > 0);
            }

            if (fd_use_cnt[kq->kq_id] == 0) {
                dbg_printf("kq=%p - fd=%i use_count=%u cleaning up...", kq, kq->kq_id, fd_use_cnt[kq->kq_id]);
                kqueue_free(kq);
            } else {
                dbg_printf("kq=%p - fd=%i is alive use_count=%u.  Skipping, this is likely a leak...",
                           kq, kq->kq_id, fd_use_cnt[kq->kq_id]);
            }
        }

        if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_UNLOCKED)
            tracing_mutex_unlock(&kq_mtx);
    }

    dbg_printf("tid=%u - monitoring thread exiting (%s)",
               monitoring_tid,
               monitoring_thread_state == THREAD_EXIT_STATE_SELF_CANCEL ? "no kqueues" : "process term");
    /* Free thread resources */
    free(fd_map);
    fd_map = NULL;
    free(fd_use_cnt);
    fd_use_cnt = NULL;

    /* Reset so that thread can be restarted */
    monitoring_tid = 0;

    if (monitoring_thread_state == THREAD_EXIT_STATE_CANCEL_LOCKED)
        tracing_mutex_unlock(&kq_mtx);
}